

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O0

void __thiscall
directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>::
for_each_cell<directed_flag_complex_in_memory_computer::reorder_edges_t>
          (directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *this,reorder_edges_t *f,
          int min_dimension,int max_dimension,vertex_index_t *prefix,int prefix_size)

{
  bool bVar1;
  reference ppVar2;
  int in_ECX;
  int in_EDX;
  int iVar3;
  directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *in_RSI;
  pair<int,_float> *in_RDI;
  long in_R8;
  int in_R9D;
  pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_> child;
  iterator __end0;
  iterator __begin0;
  map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
  *__range2;
  undefined8 in_stack_ffffffffffffffa0;
  _Rb_tree_iterator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  *this_00;
  vertex_index_t *in_stack_ffffffffffffffa8;
  reorder_edges_t *in_stack_ffffffffffffffb0;
  _Self local_40;
  _Self local_38;
  pair<int,_float> pVar4;
  undefined4 in_stack_ffffffffffffffd8;
  
  iVar3 = in_R9D + 1;
  *(short *)(in_R8 + (long)in_R9D * 2) = (short)in_RDI->first;
  if (in_EDX + 1 <= iVar3) {
    directed_flag_complex_in_memory_computer::reorder_edges_t::operator()
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),in_RDI);
  }
  if ((iVar3 != in_ECX + 1) && (in_RDI[2] != (pair<int,_float>)0x0)) {
    pVar4 = in_RDI[2];
    local_38._M_node =
         (_Base_ptr)
         std::
         map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
         ::begin((map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
                  *)in_RDI);
    local_40._M_node =
         (_Base_ptr)
         std::
         map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
         ::end((map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
                *)in_RDI);
    while (bVar1 = std::operator!=(&local_38,&local_40), bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
                            *)0x1d5cf8);
      this_00 = *(_Rb_tree_iterator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
                  **)ppVar2;
      for_each_cell<directed_flag_complex_in_memory_computer::reorder_edges_t>
                (in_RSI,(reorder_edges_t *)CONCAT44(in_EDX,in_ECX),(int)((ulong)in_R8 >> 0x20),
                 (int)in_R8,(vertex_index_t *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),
                 (int)pVar4.second);
      std::
      _Rb_tree_iterator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
      ::operator++(this_00);
    }
  }
  return;
}

Assistant:

void for_each_cell(Func& f, int min_dimension, int max_dimension, vertex_index_t* prefix, int prefix_size = 0) {
		prefix[prefix_size++] = vertex;
		if (prefix_size >= min_dimension + 1) f(prefix, prefix_size, data);
		if (prefix_size == max_dimension + 1 || children == nullptr) return;

		for (auto child : *children) child.second.for_each_cell(f, min_dimension, max_dimension, prefix, prefix_size);
	}